

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mf.cc
# Opt level: O1

void predict<true>(mf *data,single_learner *base,example *ec)

{
  uint64_t *puVar1;
  uchar uVar2;
  uchar *puVar3;
  char *pcVar4;
  pointer pbVar5;
  int iVar6;
  long lVar7;
  size_t k;
  ulong uVar8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  float fVar9;
  string *i;
  float local_5c;
  uchar local_55;
  float local_54;
  features *local_50;
  pointer local_48;
  pointer local_40;
  long local_38;
  
  v_array<float>::resize(&data->sub_predictions,data->rank * 2 + 1);
  (**(code **)(base + 0x30))(*(undefined8 *)(base + 0x18),*(undefined8 *)(base + 0x20),ec);
  *(data->sub_predictions)._begin = ec->partial_prediction;
  local_5c = ec->partial_prediction + 0.0;
  v_array<unsigned_char>::clear(&data->predict_indices);
  puVar3 = (ec->super_example_predict).indices._begin;
  push_many<unsigned_char>
            (&data->predict_indices,puVar3,
             (long)(ec->super_example_predict).indices._end - (long)puVar3);
  v_array<unsigned_char>::clear((v_array<unsigned_char> *)ec);
  local_55 = '\0';
  v_array<unsigned_char>::push_back((v_array<unsigned_char> *)ec,&local_55);
  pbVar5 = (data->pairs).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_48 = (data->pairs).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar5 != local_48) {
    local_50 = (ec->super_example_predict).feature_space;
    do {
      pcVar4 = (pbVar5->_M_dataplus)._M_p;
      lVar7 = (long)*pcVar4;
      local_40 = pbVar5;
      if (((local_50[lVar7].values._end != local_50[lVar7].values._begin) &&
          (uVar2 = pcVar4[1],
          local_50[(char)uVar2].values._end != local_50[(char)uVar2].values._begin)) &&
         (data->rank != 0)) {
        uVar8 = 1;
        local_38 = lVar7;
        do {
          *(ec->super_example_predict).indices._begin = (uchar)local_38;
          iVar6 = (int)uVar8;
          puVar1 = &(ec->super_example_predict).ft_offset;
          *puVar1 = *puVar1 + (ulong)(uint)(*(int *)(base + 0xe0) * iVar6);
          (**(code **)(base + 0x30))(*(undefined8 *)(base + 0x18),*(undefined8 *)(base + 0x20),ec);
          puVar1 = &(ec->super_example_predict).ft_offset;
          *puVar1 = *puVar1 - (ulong)(uint)(*(int *)(base + 0xe0) * iVar6);
          local_54 = ec->partial_prediction;
          (data->sub_predictions)._begin[uVar8 * 2 + -1] = local_54;
          *(ec->super_example_predict).indices._begin = uVar2;
          iVar6 = (int)data->rank + iVar6;
          puVar1 = &(ec->super_example_predict).ft_offset;
          *puVar1 = *puVar1 + (ulong)(uint)(*(int *)(base + 0xe0) * iVar6);
          (**(code **)(base + 0x30))(*(undefined8 *)(base + 0x18),*(undefined8 *)(base + 0x20),ec);
          puVar1 = &(ec->super_example_predict).ft_offset;
          *puVar1 = *puVar1 - (ulong)(uint)(iVar6 * *(int *)(base + 0xe0));
          fVar9 = ec->partial_prediction;
          (data->sub_predictions)._begin[uVar8 * 2] = fVar9;
          local_5c = local_5c + local_54 * fVar9;
          uVar8 = uVar8 + 1;
        } while (uVar8 <= data->rank);
      }
      pbVar5 = local_40 + 1;
    } while (pbVar5 != local_48);
  }
  v_array<unsigned_char>::clear((v_array<unsigned_char> *)ec);
  puVar3 = (data->predict_indices)._begin;
  push_many<unsigned_char>
            ((v_array<unsigned_char> *)ec,puVar3,(long)(data->predict_indices)._end - (long)puVar3);
  ec->partial_prediction = local_5c;
  fVar9 = GD::finalize_prediction(data->all->sd,local_5c);
  (ec->pred).scalar = fVar9;
  return;
}

Assistant:

void predict(mf& data, single_learner& base, example& ec)
{
  float prediction = 0;
  if (cache_sub_predictions)
    data.sub_predictions.resize(2 * data.rank + 1);

  // predict from linear terms
  base.predict(ec);

  // store linear prediction
  if (cache_sub_predictions)
    data.sub_predictions[0] = ec.partial_prediction;
  prediction += ec.partial_prediction;

  // store namespace indices
  copy_array(data.predict_indices, ec.indices);

  // erase indices
  ec.indices.clear();
  ec.indices.push_back(0);

  // add interaction terms to prediction
  for (string& i : data.pairs)
  {
    int left_ns = (int)i[0];
    int right_ns = (int)i[1];

    if (ec.feature_space[left_ns].size() > 0 && ec.feature_space[right_ns].size() > 0)
    {
      for (size_t k = 1; k <= data.rank; k++)
      {
        ec.indices[0] = left_ns;

        // compute l^k * x_l using base learner
        base.predict(ec, k);
        float x_dot_l = ec.partial_prediction;
        if (cache_sub_predictions)
          data.sub_predictions[2 * k - 1] = x_dot_l;

        // set example to right namespace only
        ec.indices[0] = right_ns;

        // compute r^k * x_r using base learner
        base.predict(ec, k + data.rank);
        float x_dot_r = ec.partial_prediction;
        if (cache_sub_predictions)
          data.sub_predictions[2 * k] = x_dot_r;

        // accumulate prediction
        prediction += (x_dot_l * x_dot_r);
      }
    }
  }
  // restore namespace indices and label
  copy_array(ec.indices, data.predict_indices);

  // finalize prediction
  ec.partial_prediction = prediction;
  ec.pred.scalar = GD::finalize_prediction(data.all->sd, ec.partial_prediction);
}